

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManSetPiRandom(Gli_Man_t *p,float PiTransProb)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int i;
  long lVar4;
  
  if ((0.0 < PiTransProb) && (PiTransProb < 1.0)) {
    p->vCisChanged->nSize = 0;
    i = 0;
    while( true ) {
      if (p->vCis->nSize <= i) {
        return;
      }
      iVar2 = Vec_IntEntry(p->vCis,i);
      piVar1 = p->pObjData;
      if (piVar1 == (int *)0x0) break;
      uVar3 = Gia_ManRandom(0);
      if ((float)(uVar3 & 0xffff) * 1.5258789e-05 < PiTransProb) {
        lVar4 = (long)iVar2;
        Vec_IntPush(p->vCisChanged,piVar1[lVar4 + 1]);
        *(byte *)(piVar1 + lVar4) = *(byte *)(piVar1 + lVar4) ^ 6;
        *(ulong *)(piVar1 + lVar4 + 5) =
             CONCAT44((int)((ulong)*(undefined8 *)(piVar1 + lVar4 + 5) >> 0x20) + 1,
                      (int)*(undefined8 *)(piVar1 + lVar4 + 5) + 1);
      }
      i = i + 1;
    }
    return;
  }
  __assert_fail("0.0 < PiTransProb && PiTransProb < 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaGlitch.c"
                ,0x1b0,"void Gli_ManSetPiRandom(Gli_Man_t *, float)");
}

Assistant:

void Gli_ManSetPiRandom( Gli_Man_t * p, float PiTransProb )
{
    Gli_Obj_t * pObj;
    float Multi = 1.0 / (1 << 16);
    int i;
    assert( 0.0 < PiTransProb && PiTransProb < 1.0 );
    Vec_IntClear( p->vCisChanged );
    Gli_ManForEachCi( p, pObj, i )
        if ( Multi * (Gia_ManRandom(0) & 0xffff) < PiTransProb )
        {
            Vec_IntPush( p->vCisChanged, pObj->Handle );
            pObj->fPhase  ^= 1;
            pObj->fPhase2 ^= 1;
            pObj->nSwitches++;
            pObj->nGlitches++;
        }
}